

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-server.c
# Opt level: O1

int lws_tls_server_vhost_backend_init(lws_context_creation_info *info,lws_vhost *vhost,lws *wsi)

{
  int iVar1;
  SSL_METHOD *meth;
  SSL_CTX *ssl;
  undefined8 uVar2;
  ulong e;
  char *pcVar3;
  char *format;
  
  meth = (SSL_METHOD *)TLS_server_method();
  if (meth == (SSL_METHOD *)0x0) {
    e = ERR_get_error();
    pcVar3 = ERR_error_string(e,(char *)vhost->context->pt[0].serv_buf);
    format = "problem creating ssl method %lu: %s\n";
  }
  else {
    ssl = SSL_CTX_new(meth);
    (vhost->tls).ssl_ctx = (lws_tls_ctx *)ssl;
    if (ssl != (SSL_CTX *)0x0) {
      SSL_CTX_set_ex_data(ssl,openssl_SSL_CTX_private_data_index,vhost->context);
      SSL_CTX_set_options((vhost->tls).ssl_ctx,0x2000000);
      SSL_CTX_set_options((vhost->tls).ssl_ctx,0x20000);
      SSL_CTX_set_options((vhost->tls).ssl_ctx,0);
      SSL_CTX_set_options((vhost->tls).ssl_ctx,0x400000);
      if (info->ssl_cipher_list != (char *)0x0) {
        SSL_CTX_set_cipher_list((SSL_CTX *)(vhost->tls).ssl_ctx,info->ssl_cipher_list);
      }
      if (info->tls1_3_plus_cipher_list != (char *)0x0) {
        SSL_CTX_set_ciphersuites((vhost->tls).ssl_ctx);
      }
      SSL_CTX_callback_ctrl((SSL_CTX *)(vhost->tls).ssl_ctx,0x35,lws_ssl_server_name_cb);
      SSL_CTX_ctrl((SSL_CTX *)(vhost->tls).ssl_ctx,0x36,0,vhost->context);
      if ((info->ssl_ca_filepath != (char *)0x0) &&
         (iVar1 = SSL_CTX_load_verify_locations
                            ((SSL_CTX *)(vhost->tls).ssl_ctx,info->ssl_ca_filepath,(char *)0x0),
         iVar1 == 0)) {
        _lws_log(1,"%s: SSL_CTX_load_verify_locations unhappy\n","lws_tls_server_vhost_backend_init"
                );
      }
      if (info->ssl_options_set != 0) {
        SSL_CTX_set_options((vhost->tls).ssl_ctx);
      }
      if (info->ssl_options_clear != 0) {
        SSL_CTX_clear_options((vhost->tls).ssl_ctx);
      }
      uVar2 = SSL_CTX_get_options((vhost->tls).ssl_ctx);
      _lws_log(8," SSL options 0x%lX\n",uVar2);
      if ((vhost->tls).use_ssl == 0) {
        return 0;
      }
      if ((info->ssl_cert_filepath == (char *)0x0) && (info->server_ssl_cert_mem == (void *)0x0)) {
        return 0;
      }
      lws_ssl_bind_passphrase((vhost->tls).ssl_ctx,0,info);
      iVar1 = lws_tls_server_certs_load
                        (vhost,wsi,info->ssl_cert_filepath,info->ssl_private_key_filepath,
                         (char *)info->server_ssl_cert_mem,(ulong)info->server_ssl_cert_mem_len,
                         (char *)info->server_ssl_private_key_mem,
                         (ulong)info->server_ssl_private_key_mem_len);
      return iVar1;
    }
    e = ERR_get_error();
    pcVar3 = ERR_error_string(e,(char *)vhost->context->pt[0].serv_buf);
    format = "problem creating ssl context %lu: %s\n";
  }
  _lws_log(1,format,e,pcVar3);
  return 1;
}

Assistant:

int
lws_tls_server_vhost_backend_init(const struct lws_context_creation_info *info,
				  struct lws_vhost *vhost, struct lws *wsi)
{
	unsigned long error;
	SSL_METHOD *method = (SSL_METHOD *)SSLv23_server_method();

	if (!method) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl method %lu: %s\n",
				error, ERR_error_string(error,
				      (char *)vhost->context->pt[0].serv_buf));
		return 1;
	}
	vhost->tls.ssl_ctx = SSL_CTX_new(method);	/* create context */
	if (!vhost->tls.ssl_ctx) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl context %lu: %s\n",
				error, ERR_error_string(error,
				      (char *)vhost->context->pt[0].serv_buf));
		return 1;
	}

	SSL_CTX_set_ex_data(vhost->tls.ssl_ctx,
			    openssl_SSL_CTX_private_data_index,
			    (char *)vhost->context);
	/* Disable SSLv2 and SSLv3 */
	SSL_CTX_set_options(vhost->tls.ssl_ctx, SSL_OP_NO_SSLv2 |
						SSL_OP_NO_SSLv3);
#ifdef SSL_OP_NO_COMPRESSION
	SSL_CTX_set_options(vhost->tls.ssl_ctx, SSL_OP_NO_COMPRESSION);
#endif
	SSL_CTX_set_options(vhost->tls.ssl_ctx, SSL_OP_SINGLE_DH_USE);
	SSL_CTX_set_options(vhost->tls.ssl_ctx, SSL_OP_CIPHER_SERVER_PREFERENCE);

	if (info->ssl_cipher_list)
		SSL_CTX_set_cipher_list(vhost->tls.ssl_ctx, info->ssl_cipher_list);

#if defined(LWS_HAVE_SSL_CTX_set_ciphersuites)
	if (info->tls1_3_plus_cipher_list)
		SSL_CTX_set_ciphersuites(vhost->tls.ssl_ctx,
					 info->tls1_3_plus_cipher_list);
#endif

#if !defined(OPENSSL_NO_TLSEXT)
	SSL_CTX_set_tlsext_servername_callback(vhost->tls.ssl_ctx,
					       lws_ssl_server_name_cb);
	SSL_CTX_set_tlsext_servername_arg(vhost->tls.ssl_ctx, vhost->context);
#endif

	if (info->ssl_ca_filepath &&
	    !SSL_CTX_load_verify_locations(vhost->tls.ssl_ctx,
					   info->ssl_ca_filepath, NULL)) {
		lwsl_err("%s: SSL_CTX_load_verify_locations unhappy\n",
			 __func__);
	}

	if (info->ssl_options_set)
		SSL_CTX_set_options(vhost->tls.ssl_ctx, info->ssl_options_set);

/* SSL_clear_options introduced in 0.9.8m */
#if (OPENSSL_VERSION_NUMBER >= 0x009080df) && !defined(USE_WOLFSSL)
	if (info->ssl_options_clear)
		SSL_CTX_clear_options(vhost->tls.ssl_ctx,
				      info->ssl_options_clear);
#endif

	lwsl_info(" SSL options 0x%lX\n",
			(unsigned long)SSL_CTX_get_options(vhost->tls.ssl_ctx));
	if (!vhost->tls.use_ssl ||
	    (!info->ssl_cert_filepath && !info->server_ssl_cert_mem))
		return 0;

	lws_ssl_bind_passphrase(vhost->tls.ssl_ctx, 0, info);

	return lws_tls_server_certs_load(vhost, wsi, info->ssl_cert_filepath,
					 info->ssl_private_key_filepath,
					 info->server_ssl_cert_mem,
					 info->server_ssl_cert_mem_len,
					 info->server_ssl_private_key_mem,
					 info->server_ssl_private_key_mem_len);
}